

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_crt.c
# Opt level: O0

int x509_write_time(uchar **p,uchar *start,char *time,size_t size)

{
  int iVar1;
  int iVar2;
  int local_40;
  size_t len;
  int ret;
  size_t size_local;
  char *time_local;
  uchar *start_local;
  uchar **p_local;
  
  if (((*time == '2') && (time[1] == '0')) && (time[2] < '5')) {
    iVar1 = mbedtls_asn1_write_raw_buffer(p,start,(uchar *)(time + 2),size - 2);
    if (iVar1 < 0) {
      return iVar1;
    }
    iVar2 = mbedtls_asn1_write_len(p,start,(long)iVar1);
    if (iVar2 < 0) {
      return iVar2;
    }
    local_40 = mbedtls_asn1_write_tag(p,start,'\x17');
    if (local_40 < 0) {
      return local_40;
    }
    local_40 = local_40 + iVar2 + iVar1;
  }
  else {
    iVar1 = mbedtls_asn1_write_raw_buffer(p,start,(uchar *)time,size);
    if (iVar1 < 0) {
      return iVar1;
    }
    iVar2 = mbedtls_asn1_write_len(p,start,(long)iVar1);
    if (iVar2 < 0) {
      return iVar2;
    }
    local_40 = mbedtls_asn1_write_tag(p,start,'\x18');
    if (local_40 < 0) {
      return local_40;
    }
    local_40 = local_40 + iVar2 + iVar1;
  }
  return local_40;
}

Assistant:

static int x509_write_time( unsigned char **p, unsigned char *start,
                            const char *time, size_t size )
{
    int ret;
    size_t len = 0;

    /*
     * write MBEDTLS_ASN1_UTC_TIME if year < 2050 (2 bytes shorter)
     */
    if( time[0] == '2' && time[1] == '0' && time [2] < '5' )
    {
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_raw_buffer( p, start,
                                             (const unsigned char *) time + 2,
                                             size - 2 ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_UTC_TIME ) );
    }
    else
    {
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_raw_buffer( p, start,
                                                  (const unsigned char *) time,
                                                  size ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_GENERALIZED_TIME ) );
    }

    return( (int) len );
}